

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polygon.cc
# Opt level: O0

bool gimage::anon_unknown_0::nextContourPixel
               (long *x,long *y,int *from_dir,ImageU8 *mask,ImageU8 *image,long sx,long sy)

{
  bool bVar1;
  store_t sVar2;
  store_t sVar3;
  long i;
  long k;
  long lVar4;
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *in_RCX;
  int *in_RDX;
  long *in_RSI;
  long *in_RDI;
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *in_R8;
  long in_R9;
  long in_stack_00000008;
  long yy;
  long xx;
  int dir;
  int ret;
  uint8 c;
  int local_3c;
  
  sVar2 = Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::get(in_R8,*in_RDI,*in_RSI,0);
  bVar1 = false;
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::set(in_RCX,*in_RDI,*in_RSI,0,0xff);
  local_3c = *in_RDX;
  while( true ) {
    local_3c = (local_3c + 1) % 8;
    if (local_3c == *in_RDX || bVar1) {
      return bVar1;
    }
    i = *in_RDI + nextContourPixel::dx[local_3c];
    k = *in_RSI + nextContourPixel::dy[local_3c];
    if ((i == in_R9) && (k == in_stack_00000008)) break;
    if ((((-1 < i) && (-1 < k)) &&
        (lVar4 = Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getWidth(in_R8),
        i < lVar4)) &&
       (((lVar4 = Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getHeight(in_R8),
         k < lVar4 &&
         (sVar3 = Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::get(in_R8,i,k,0),
         sVar3 == sVar2)) &&
        (sVar3 = Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::get(in_RCX,i,k,0),
        sVar3 == '\0')))) {
      *in_RDI = i;
      *in_RSI = k;
      *in_RDX = (local_3c + 4) % 8;
      bVar1 = true;
    }
  }
  return bVar1;
}

Assistant:

inline bool nextContourPixel(long &x, long &y, int &from_dir, ImageU8 &mask, const ImageU8 &image,
  long sx, long sy)
{
  static const long dx[]={-1, -1,  0,  1, 1,  1,  0, -1};
  static const long dy[]={ 0,  1,  1,  1, 0, -1, -1, -1};
  gutil::uint8 c=image.get(x, y);
  int ret=false;

  mask.set(x, y, 0, 255); // mark current pixel as used

  int dir=(from_dir+1)%8;
  while (dir != from_dir && !ret)
  {
    long xx=x+dx[dir];
    long yy=y+dy[dir];

    if (xx == sx && yy == sy)
    {
      break;
    }

    if (xx >= 0 && yy >= 0 && xx < image.getWidth() && yy < image.getHeight())
    {
      if (image.get(xx, yy) == c && mask.get(xx, yy) == 0)
      {
        // advance to next pixel

        x=xx;
        y=yy;
        from_dir=(dir+4)%8;

        ret=true;
      }
    }

    dir=(dir+1)%8;
  }

  return ret;
}